

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo.cpp
# Opt level: O0

QString * __thiscall QFileInfo::fileName(QFileInfo *this)

{
  bool bVar1;
  QFileInfoPrivate *pQVar2;
  pointer pQVar3;
  QString *in_RDI;
  QLatin1StringView QVar4;
  QLatin1StringView in_stack_00000000;
  QFileInfoPrivate *d;
  QString *size;
  QFileSystemEntry *in_stack_ffffffffffffffd8;
  
  size = in_RDI;
  pQVar2 = d_func((QFileInfo *)0x2abe78);
  if ((*(uint *)&pQVar2->field_0x1d8 >> 0x1e & 1) == 0) {
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *
                       )0x2abed2);
    if (bVar1) {
      pQVar3 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::
               operator->((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                           *)0x2abef8);
      (*pQVar3->_vptr_QAbstractFileEngine[0x19])(in_RDI,pQVar3,1);
    }
    else {
      QFileSystemEntry::fileName(in_stack_ffffffffffffffd8);
    }
  }
  else {
    QVar4 = Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_stack_ffffffffffffffd8,(size_t)size);
    QString::QString((QString *)QVar4.m_data,in_stack_00000000);
  }
  return size;
}

Assistant:

QString QFileInfo::fileName() const
{
    Q_D(const QFileInfo);
    if (d->isDefaultConstructed)
        return ""_L1;
    if (!d->fileEngine)
        return d->fileEntry.fileName();
    return d->fileEngine->fileName(QAbstractFileEngine::BaseName);
}